

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotErrorBarsHEx<ImPlot::GetterError<double>>
               (char *label_id,GetterError<double> *getter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col;
  long lVar6;
  ImDrawList *this;
  int iVar7;
  int iVar8;
  float fVar9;
  ImVec2 p1;
  ImVec2 p2;
  ImVec2 local_88;
  ImPlotPoint local_80;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar5 = BeginItem(label_id,-1);
  if (bVar5) {
    if ((GImPlot->FitThisFrame == true) && (iVar7 = getter->Count, 0 < iVar7)) {
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        dVar1 = *(double *)((long)getter->Xs + lVar6);
        dVar2 = *(double *)((long)getter->Ys + lVar6);
        local_80.x = dVar1 - *(double *)((long)getter->Neg + lVar6);
        dVar3 = *(double *)((long)getter->Pos + lVar6);
        local_80.y = dVar2;
        FitPoint(&local_80);
        local_80.x = dVar1 + dVar3;
        local_80.y = dVar2;
        FitPoint(&local_80);
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar4->NextItemData).Colors + 4);
    iVar7 = getter->Count;
    if (0 < iVar7) {
      local_6c = (pIVar4->NextItemData).ErrorBarSize;
      local_48 = ZEXT416((uint)(local_6c * 0.5));
      local_58 = ZEXT416((uint)(local_6c * 0.5)) << 0x20;
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        dVar1 = *(double *)((long)getter->Xs + lVar6);
        dVar2 = *(double *)((long)getter->Ys + lVar6);
        dVar3 = *(double *)((long)getter->Pos + lVar6);
        local_80.x = (double)PlotToPixels(dVar1 - *(double *)((long)getter->Neg + lVar6),dVar2,-1);
        local_60 = PlotToPixels(dVar1 + dVar3,dVar2,-1);
        ImDrawList::AddLine(this,(ImVec2 *)&local_80,&local_60,col,
                            (pIVar4->NextItemData).ErrorBarWeight);
        if (0.0 < local_6c) {
          local_88.x = SUB84(local_80.x,0);
          fVar9 = (float)((ulong)local_80.x >> 0x20);
          local_68.x = (float)local_58._0_4_ + local_88.x;
          local_68.y = (float)local_58._4_4_ + fVar9;
          local_88.y = fVar9 - (float)local_48._0_4_;
          ImDrawList::AddLine(this,&local_88,&local_68,col,(pIVar4->NextItemData).ErrorBarWeight);
          local_88.x = local_60.x;
          local_68.x = (float)local_58._0_4_ + local_88.x;
          local_68.y = (float)local_58._4_4_ + local_60.y;
          local_88.y = local_60.y - (float)local_48._0_4_;
          ImDrawList::AddLine(this,&local_88,&local_68,col,(pIVar4->NextItemData).ErrorBarWeight);
        }
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsHEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X - e.Neg, e.Y));
                FitPoint(ImPlotPoint(e.X + e.Pos, e.Y));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X - e.Neg, e.Y);
            ImVec2 p2 = PlotToPixels(e.X + e.Pos, e.Y);
            DrawList.AddLine(p1, p2, col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(0, half_whisker), p1 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(0, half_whisker), p2 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}